

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

string * __thiscall
tinyusdz::tydra::to_string_abi_cxx11_(string *__return_storage_ptr__,tydra *this,WrapMode mode)

{
  WrapMode mode_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xffffffff) {
  case 0:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"clamp_to_edge");
    break;
  case 1:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"repeat");
    break;
  case 2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mirror");
    break;
  case 3:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"clamp_to_border");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(UVTexture::WrapMode mode) {
  std::string s;
  switch (mode) {
    case UVTexture::WrapMode::REPEAT: {
      s = "repeat";
      break;
    }
    case UVTexture::WrapMode::CLAMP_TO_BORDER: {
      s = "clamp_to_border";
      break;
    }
    case UVTexture::WrapMode::CLAMP_TO_EDGE: {
      s = "clamp_to_edge";
      break;
    }
    case UVTexture::WrapMode::MIRROR: {
      s = "mirror";
      break;
    }
  }

  return s;
}